

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void count(void)

{
  LogLevel LVar1;
  Configuration *this;
  allocator local_1e9;
  string local_1e8 [55];
  allocator local_1b1;
  string local_1b0 [32];
  LLogMessage local_190;
  int local_c [2];
  int i;
  
  for (local_c[0] = 0; local_c[0] < 99; local_c[0] = local_c[0] + 1) {
    this = ins::Configuration::GetInstance();
    LVar1 = ins::Configuration::log_level(this);
    if ((int)LVar1 < 2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1b0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jerett[P]llog/main.cpp",
                 &local_1b1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1e8,"count",&local_1e9);
      ins::LLogMessage::LLogMessage(&local_190,(string *)local_1b0,(string *)local_1e8,0x13,1);
      ins::LLogMessage::operator<<(&local_190,local_c);
      ins::LLogMessage::~LLogMessage(&local_190);
      std::__cxx11::string::~string(local_1e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
      std::__cxx11::string::~string(local_1b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
    }
  }
  return;
}

Assistant:

void count() {
  for (int i = 0 ; i < 99; ++i) {
    LOG(INFO) << i;
//    CHECK(i < 90) << " meet 90 first i:" << i;
  }
}